

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::TypedExpectation<void_(SDL_Surface_*)>::ShouldHandleArguments
          (TypedExpectation<void_(SDL_Surface_*)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  bVar1 = ExpectationBase::is_retired(&this->super_ExpectationBase);
  if (!bVar1) {
    bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied(&this->super_ExpectationBase);
    if (bVar1) {
      bVar1 = Matches(this,args);
      return bVar1;
    }
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // In case the action count wasn't checked when the expectation
    // was defined (e.g. if this expectation has no WillRepeatedly()
    // or RetiresOnSaturation() clause), we check it when the
    // expectation is used for the first time.
    CheckActionCountIfNotDone();
    return !is_retired() && AllPrerequisitesAreSatisfied() && Matches(args);
  }